

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_ledger.cpp
# Opt level: O0

int CfdFreeTxSerializeForLedger(void *handle,void *serialize_handle)

{
  void *pvVar1;
  string *in_RSI;
  CfdException *except;
  exception *std_except;
  CfdCapiLedgerMetaData *metadata_struct;
  int result;
  vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
  *in_stack_ffffffffffffff80;
  allocator *paVar2;
  allocator local_59;
  string local_58 [28];
  uint32_t in_stack_ffffffffffffffc4;
  string *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  
  cfd::Initialize();
  if ((in_RSI != (string *)0x0) &&
     (in_stack_ffffffffffffffc8 = in_RSI, (in_RSI->field_2)._M_allocated_capacity != 0)) {
    pvVar1 = (void *)(in_RSI->field_2)._M_allocated_capacity;
    if (pvVar1 != (void *)0x0) {
      std::
      vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
      ::~vector(in_stack_ffffffffffffff80);
      operator_delete(pvVar1);
    }
    (in_RSI->field_2)._M_allocated_capacity = 0;
    in_stack_ffffffffffffffc8 = in_RSI;
  }
  paVar2 = &local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"LedgerMetaData",paVar2);
  cfd::capi::FreeBuffer
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return 0;
}

Assistant:

int CfdFreeTxSerializeForLedger(void* handle, void* serialize_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (serialize_handle != nullptr) {
      CfdCapiLedgerMetaData* metadata_struct =
          static_cast<CfdCapiLedgerMetaData*>(serialize_handle);
      if (metadata_struct->metadata_stack != nullptr) {
        delete metadata_struct->metadata_stack;
        metadata_struct->metadata_stack = nullptr;
      }
    }
    FreeBuffer(
        serialize_handle, kPrefixLedgerMetaData,
        sizeof(CfdCapiLedgerMetaData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}